

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O1

int Curl_splayremove(Curl_tree *t,Curl_tree *removenode,Curl_tree **newroot)

{
  long lVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  Curl_tree *pCVar6;
  curltime i;
  curltime i_00;
  
  iVar5 = 1;
  if (removenode != (Curl_tree *)0x0 && t != (Curl_tree *)0x0) {
    lVar1 = (removenode->key).tv_sec;
    if ((lVar1 == -1) && ((removenode->key).tv_usec == -1)) {
      if (removenode->samen == removenode) {
        return 3;
      }
      pCVar6 = removenode->samep;
      pCVar6->samen = removenode->samen;
      removenode->samen->samep = pCVar6;
      removenode->samen = removenode;
    }
    else {
      i.tv_usec = (removenode->key).tv_usec;
      i.tv_sec = lVar1;
      i._12_4_ = 0;
      pCVar6 = Curl_splay(i,t);
      if (pCVar6 != removenode) {
        return 2;
      }
      t = pCVar6->samen;
      if (t == pCVar6) {
        if (pCVar6->smaller == (Curl_tree *)0x0) {
          t = pCVar6->larger;
        }
        else {
          uVar2 = (removenode->key).tv_sec;
          uVar3 = (removenode->key).tv_usec;
          i_00.tv_usec = uVar3;
          i_00.tv_sec = uVar2;
          i_00._12_4_ = 0;
          t = Curl_splay(i_00,pCVar6->smaller);
          t->larger = pCVar6->larger;
        }
      }
      else {
        iVar5 = (pCVar6->key).tv_usec;
        uVar4 = *(undefined4 *)&(pCVar6->key).field_0xc;
        (t->key).tv_sec = (pCVar6->key).tv_sec;
        (t->key).tv_usec = iVar5;
        *(undefined4 *)&(t->key).field_0xc = uVar4;
        t->larger = pCVar6->larger;
        t->smaller = pCVar6->smaller;
        t->samep = pCVar6->samep;
        pCVar6->samep->samen = t;
      }
    }
    *newroot = t;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int Curl_splayremove(struct Curl_tree *t,
                     struct Curl_tree *removenode,
                     struct Curl_tree **newroot)
{
  static const struct curltime KEY_NOTUSED = {
    ~0, -1
  }; /* will *NEVER* appear */
  struct Curl_tree *x;

  if(!t || !removenode)
    return 1;

  if(compare(KEY_NOTUSED, removenode->key) == 0) {
    /* Key set to NOTUSED means it is a subnode within a 'same' linked list
       and thus we can unlink it easily. */
    if(removenode->samen == removenode)
      /* A non-subnode should never be set to KEY_NOTUSED */
      return 3;

    removenode->samep->samen = removenode->samen;
    removenode->samen->samep = removenode->samep;

    /* Ensures that double-remove gets caught. */
    removenode->samen = removenode;

    *newroot = t; /* return the same root */
    return 0;
  }

  t = Curl_splay(removenode->key, t);

  /* First make sure that we got the same root node as the one we want
     to remove, as otherwise we might be trying to remove a node that
     isn't actually in the tree.

     We cannot just compare the keys here as a double remove in quick
     succession of a node with key != KEY_NOTUSED && same != NULL
     could return the same key but a different node. */
  if(t != removenode)
    return 2;

  /* Check if there is a list with identical sizes, as then we're trying to
     remove the root node of a list of nodes with identical keys. */
  x = t->samen;
  if(x != t) {
    /* 'x' is the new root node, we just make it use the root node's
       smaller/larger links */

    x->key = t->key;
    x->larger = t->larger;
    x->smaller = t->smaller;
    x->samep = t->samep;
    t->samep->samen = x;
  }
  else {
    /* Remove the root node */
    if(!t->smaller)
      x = t->larger;
    else {
      x = Curl_splay(removenode->key, t->smaller);
      x->larger = t->larger;
    }
  }

  *newroot = x; /* store new root pointer */

  return 0;
}